

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O3

BUFFER_HANDLE Azure_Base64_Decode(char *source)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  LOGGER_LOG p_Var4;
  BUFFER_HANDLE handle;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  size_t length;
  size_t size;
  ulong uVar8;
  byte bVar9;
  char *pcVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  
  if (source == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar10 = "invalid parameter const char* source=%p";
      iVar2 = 0xc1;
LAB_00164905:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                ,"Azure_Base64_Decode",iVar2,1,pcVar10);
      return (BUFFER_HANDLE)0x0;
    }
  }
  else {
    sVar3 = strlen(source);
    if ((sVar3 & 3) == 0) {
      handle = BUFFER_new();
      if (handle == (BUFFER_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar10 = "Could not create a buffer to decoding.";
          iVar2 = 0xd1;
          goto LAB_00164905;
        }
      }
      else {
        sVar3 = strlen(source);
        if (sVar3 == 0) {
          return handle;
        }
        size = (sVar3 >> 2) * 3;
        if (source[sVar3 - 1] == '=') {
          size = size + ~(ulong)(source[sVar3 - 2] == '=');
        }
        if (size == 0) {
          return handle;
        }
        iVar2 = BUFFER_pre_build(handle,size);
        if (iVar2 == 0) {
          puVar5 = BUFFER_u_char(handle);
          for (uVar8 = 0;
              ((bVar9 = source[uVar8], (byte)(bVar9 - 0x30) < 10 ||
               ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a)) || ((bVar9 | 4) == 0x2f)); uVar8 = uVar8 + 1)
          {
          }
          if (uVar8 < 4) {
            lVar7 = 0;
            lVar6 = 0;
          }
          else {
            lVar6 = 0;
            lVar7 = 0;
            do {
              cVar1 = source[lVar7];
              bVar9 = cVar1 + 0xbf;
              if (0x19 < bVar9) {
                if ((byte)(cVar1 + 0x9fU) < 0x1a) {
                  bVar9 = cVar1 + 0xb9;
                }
                else if ((byte)(cVar1 - 0x30U) < 10) {
                  bVar9 = cVar1 + 4;
                }
                else {
                  bVar9 = 0x3f;
                  if (cVar1 != '/') {
                    bVar9 = 0;
                  }
                  if (cVar1 == '+') {
                    bVar9 = 0x3e;
                  }
                }
              }
              cVar1 = source[lVar7 + 1];
              bVar11 = cVar1 + 0xbf;
              if (0x19 < bVar11) {
                if ((byte)(cVar1 + 0x9fU) < 0x1a) {
                  bVar11 = cVar1 + 0xb9;
                }
                else if ((byte)(cVar1 - 0x30U) < 10) {
                  bVar11 = cVar1 + 4;
                }
                else {
                  bVar11 = 0x3f;
                  if (cVar1 != '/') {
                    bVar11 = 0;
                  }
                  if (cVar1 == '+') {
                    bVar11 = 0x3e;
                  }
                }
              }
              cVar1 = source[lVar7 + 2];
              bVar12 = cVar1 + 0xbf;
              if (0x19 < bVar12) {
                if ((byte)(cVar1 + 0x9fU) < 0x1a) {
                  bVar12 = cVar1 + 0xb9;
                }
                else if ((byte)(cVar1 - 0x30U) < 10) {
                  bVar12 = cVar1 + 4;
                }
                else {
                  bVar12 = 0x3f;
                  if (cVar1 != '/') {
                    bVar12 = 0;
                  }
                  if (cVar1 == '+') {
                    bVar12 = 0x3e;
                  }
                }
              }
              cVar1 = source[lVar7 + 3];
              bVar13 = cVar1 + 0xbf;
              if (0x19 < bVar13) {
                if ((byte)(cVar1 + 0x9fU) < 0x1a) {
                  bVar13 = cVar1 + 0xb9;
                }
                else if ((byte)(cVar1 - 0x30U) < 10) {
                  bVar13 = cVar1 + 4;
                }
                else {
                  bVar13 = 0x3f;
                  if (cVar1 != '/') {
                    bVar13 = 0;
                  }
                  if (cVar1 == '+') {
                    bVar13 = 0x3e;
                  }
                }
              }
              puVar5[lVar6] = bVar11 >> 4 | bVar9 << 2;
              puVar5[lVar6 + 1] = bVar12 >> 2 | bVar11 << 4;
              puVar5[lVar6 + 2] = bVar12 << 6 | bVar13;
              lVar6 = lVar6 + 3;
              uVar8 = uVar8 - 4;
              lVar7 = lVar7 + 4;
            } while (3 < uVar8);
          }
          if (uVar8 != 3) {
            if (uVar8 != 2) {
              return handle;
            }
            cVar1 = source[lVar7];
            bVar9 = cVar1 + 0xbfU;
            if (0x19 < (byte)(cVar1 + 0xbfU)) {
              if ((byte)(cVar1 + 0x9fU) < 0x1a) {
                bVar9 = cVar1 + 0xb9;
              }
              else if ((byte)(cVar1 - 0x30U) < 10) {
                bVar9 = cVar1 + 4;
              }
              else {
                bVar11 = 0x3f;
                if (cVar1 != '/') {
                  bVar11 = 0;
                }
                bVar9 = 0x3e;
                if (cVar1 != '+') {
                  bVar9 = bVar11;
                }
              }
            }
            cVar1 = source[lVar7 + 1];
            bVar11 = cVar1 + 0xbfU;
            if (0x19 < (byte)(cVar1 + 0xbfU)) {
              if ((byte)(cVar1 + 0x9fU) < 0x1a) {
                bVar11 = cVar1 + 0xb9;
              }
              else if ((byte)(cVar1 - 0x30U) < 10) {
                bVar11 = cVar1 + 4;
              }
              else {
                bVar12 = 0x3f;
                if (cVar1 != '/') {
                  bVar12 = 0;
                }
                bVar11 = 0x3e;
                if (cVar1 != '+') {
                  bVar11 = bVar12;
                }
              }
            }
            puVar5[lVar6] = bVar11 >> 4 | bVar9 << 2;
            return handle;
          }
          cVar1 = source[lVar7];
          bVar9 = cVar1 + 0xbfU;
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            if ((byte)(cVar1 + 0x9fU) < 0x1a) {
              bVar9 = cVar1 + 0xb9;
            }
            else if ((byte)(cVar1 - 0x30U) < 10) {
              bVar9 = cVar1 + 4;
            }
            else {
              bVar11 = 0x3f;
              if (cVar1 != '/') {
                bVar11 = 0;
              }
              bVar9 = 0x3e;
              if (cVar1 != '+') {
                bVar9 = bVar11;
              }
            }
          }
          cVar1 = source[lVar7 + 1];
          bVar11 = cVar1 + 0xbfU;
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            if ((byte)(cVar1 + 0x9fU) < 0x1a) {
              bVar11 = cVar1 + 0xb9;
            }
            else if ((byte)(cVar1 - 0x30U) < 10) {
              bVar11 = cVar1 + 4;
            }
            else {
              bVar12 = 0x3f;
              if (cVar1 != '/') {
                bVar12 = 0;
              }
              bVar11 = 0x3e;
              if (cVar1 != '+') {
                bVar11 = bVar12;
              }
            }
          }
          cVar1 = source[lVar7 + 2];
          bVar12 = cVar1 + 0xbfU;
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            if ((byte)(cVar1 + 0x9fU) < 0x1a) {
              bVar12 = cVar1 + 0xb9;
            }
            else if ((byte)(cVar1 - 0x30U) < 10) {
              bVar12 = cVar1 + 4;
            }
            else {
              bVar13 = 0x3f;
              if (cVar1 != '/') {
                bVar13 = 0;
              }
              bVar12 = 0x3e;
              if (cVar1 != '+') {
                bVar12 = bVar13;
              }
            }
          }
          puVar5[lVar6] = bVar11 >> 4 | bVar9 << 2;
          puVar5[lVar6 + 1] = bVar12 >> 2 | bVar11 << 4;
          return handle;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                    ,"Azure_Base64_Decode",0xdc,1,
                    "Could not prebuild a buffer for base 64 decoding.");
        }
        BUFFER_delete(handle);
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar10 = "Invalid length Base64 string!";
        iVar2 = 0xc9;
        goto LAB_00164905;
      }
    }
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

BUFFER_HANDLE Azure_Base64_Decode(const char* source)
{
    BUFFER_HANDLE result;
    /*Codes_SRS_BASE64_06_008: [If source is NULL then Azure_Base64_Decode shall return NULL.]*/
    if (source == NULL)
    {
        LogError("invalid parameter const char* source=%p", source);
        result = NULL;
    }
    else
    {
        if ((strlen(source) % 4) != 0)
        {
            /*Codes_SRS_BASE64_06_011: [If the source string has an invalid length for a base 64 encoded string then Azure_Base64_Decode shall return NULL.]*/
            LogError("Invalid length Base64 string!");
            result = NULL;
        }
        else
        {
            if ((result = BUFFER_new()) == NULL)
            {
                /*Codes_SRS_BASE64_06_010: [If there is any memory allocation failure during the decode then Azure_Base64_Decode shall return NULL.]*/
                LogError("Could not create a buffer to decoding.");
            }
            else
            {
                size_t sizeOfOutputBuffer = Base64decode_len(source);
                /*Codes_SRS_BASE64_06_009: [If the string pointed to by source is zero length then the handle returned shall refer to a zero length buffer.]*/
                if (sizeOfOutputBuffer > 0)
                {
                    if (BUFFER_pre_build(result, sizeOfOutputBuffer) != 0)
                    {
                        /*Codes_SRS_BASE64_06_010: [If there is any memory allocation failure during the decode then Azure_Base64_Decode shall return NULL.]*/
                        LogError("Could not prebuild a buffer for base 64 decoding.");
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        Base64decode(BUFFER_u_char(result), source);
                    }
                }
            }
        }
    }
    return result;
}